

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

BitmapDibHeader * Bitmap_Operation::getInfoHeader(uint32_t size)

{
  int in_EDI;
  BitmapCoreHeader *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  if (in_EDI == 0xc) {
    local_8 = (BitmapInfoHeader *)operator_new(0x18);
    BitmapCoreHeader::BitmapCoreHeader(in_stack_ffffffffffffffd0);
  }
  else if (in_EDI == 0x28) {
    local_8 = (BitmapInfoHeader *)operator_new(0x38);
    BitmapInfoHeader::BitmapInfoHeader(local_8);
  }
  else {
    local_8 = (BitmapInfoHeader *)0x0;
  }
  return &local_8->super_BitmapDibHeader;
}

Assistant:

BitmapDibHeader * getInfoHeader( uint32_t size )
    {
        switch( size )
        {
            case 12u:
                return new BitmapCoreHeader;
            case 40u:
                return new BitmapInfoHeader;
            default:
                return nullptr;
        }
    }